

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamFtp::Seek(BamFtp *this,int64_t *position,int origin)

{
  ulong uVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  uVar1 = (**(code **)(*in_RDI + 0x50))();
  if ((uVar1 & 1) == 0) {
    local_1 = false;
  }
  else {
    TcpSocket::DisconnectFromHost((TcpSocket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    TcpSocket::DisconnectFromHost((TcpSocket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    if (in_EDX == 1) {
      in_RDI[0x23] = *in_RSI + in_RDI[0x23];
    }
    else {
      if (in_EDX != 0) {
        return false;
      }
      in_RDI[0x23] = *in_RSI;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool BamFtp::Seek(const int64_t& position, const int origin) {

    // if FTP device not in a valid state
    if ( !IsOpen() ) {
        // TODO: set error string
        return false;
    }

    // ----------------------
    // UGLY !! but works??
    // ----------------------
    // disconnect from server
    m_dataSocket->DisconnectFromHost();
    m_commandSocket->DisconnectFromHost();

    // update file position & return success
    if ( origin == SEEK_CUR )
        m_filePosition += position;
    else if ( origin == SEEK_SET)
        m_filePosition = position;
    else {
        // TODO: set error string
        return false;
    }
    return true;
}